

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestDeprecatedFields::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  TestDeprecatedFields **v1;
  TestDeprecatedFields **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other;
  uint32_t *puVar5;
  TestAllTypes_NestedMessage *pTVar6;
  TestDeprecatedFields *pTVar7;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  uint local_88;
  uint32_t cached_has_bits;
  LogMessage local_78;
  Voidify local_61;
  TestDeprecatedFields *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestDeprecatedFields *from;
  TestDeprecatedFields *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_20;
  char *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestDeprecatedFields *)to_msg;
  _this = (TestDeprecatedFields *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_60 = (TestDeprecatedFields *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestDeprecatedFields_const*>(&local_60);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestDeprecatedFields*>(&from);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestDeprecatedFields_const*,edition_unittest::TestDeprecatedFields*>
                       (v1,v2,"&from != _this");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x2d17,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_88 = 0;
  this = _internal_mutable_deprecated_repeated_string_abi_cxx11_(from);
  other = _internal_deprecated_repeated_string_abi_cxx11_((TestDeprecatedFields *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this,other);
  puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_88 = *puVar5;
  if ((local_88 & 7) != 0) {
    if ((local_88 & 1) != 0) {
      local_a1 = 0;
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x2d1f,"from._impl_.deprecated_message_ != nullptr");
        local_a1 = 1;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar4);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      if ((from->field_0)._impl_.deprecated_message_ == (TestAllTypes_NestedMessage *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_20 = absl_log_internal_check_op_result;
        pTVar6 = (TestAllTypes_NestedMessage *)
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.deprecated_message_ = pTVar6;
      }
      else {
        edition_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.deprecated_message_,
                   (TestAllTypes_NestedMessage *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_88 & 2) != 0) {
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x2d27,"from._impl_.nested_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&oneof_from_case);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case);
      }
      if ((from->field_0)._impl_.nested_ == (TestDeprecatedFields *)0x0) {
        local_18 = (arena->impl_).first_arena_.limit_;
        local_10 = absl_log_internal_check_op_result;
        pTVar7 = (TestDeprecatedFields *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestDeprecatedFields>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.nested_ = pTVar7;
      }
      else {
        MergeFrom((from->field_0)._impl_.nested_,
                  (TestDeprecatedFields *)(arena->impl_).first_arena_.limit_);
      }
    }
    if ((local_88 & 4) != 0) {
      (from->field_0)._impl_.deprecated_int32_ =
           *(int32_t *)&(arena->impl_).first_arena_.prefetch_ptr_;
    }
  }
  uVar3 = local_88;
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar5 = uVar3 | *puVar5;
  uVar1 = *(uint32_t *)&(arena->impl_).first_arena_.cleanup_list_.head_;
  if (uVar1 != 0) {
    uVar2 = (from->field_0)._impl_._oneof_case_[0];
    if (uVar2 != uVar1) {
      if (uVar2 != 0) {
        clear_oneof_fields(from);
      }
      (from->field_0)._impl_._oneof_case_[0] = uVar1;
    }
    if ((uVar1 != 0) && (uVar1 == 2)) {
      (from->field_0)._impl_.oneof_fields_ =
           *(OneofFieldsUnion *)((long)&(arena->impl_).first_arena_.prefetch_ptr_ + 4);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestDeprecatedFields::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDeprecatedFields*>(&to_msg);
  auto& from = static_cast<const TestDeprecatedFields&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestDeprecatedFields)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_deprecated_repeated_string()->MergeFrom(from._internal_deprecated_repeated_string());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.deprecated_message_ != nullptr);
      if (_this->_impl_.deprecated_message_ == nullptr) {
        _this->_impl_.deprecated_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.deprecated_message_);
      } else {
        _this->_impl_.deprecated_message_->MergeFrom(*from._impl_.deprecated_message_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_ != nullptr);
      if (_this->_impl_.nested_ == nullptr) {
        _this->_impl_.nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_);
      } else {
        _this->_impl_.nested_->MergeFrom(*from._impl_.nested_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_int32_ = from._impl_.deprecated_int32_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_fields();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kDeprecatedInt32InOneof: {
        _this->_impl_.oneof_fields_.deprecated_int32_in_oneof_ = from._impl_.oneof_fields_.deprecated_int32_in_oneof_;
        break;
      }
      case ONEOF_FIELDS_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}